

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeWithSameShape(Builder *this,Id component,Id otherType)

{
  Op OVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  Id use;
  Instruction *this_00;
  Instruction *instr;
  Id otherType_local;
  Id component_local;
  Builder *this_local;
  
  this_00 = Module::getInstruction(&this->module,otherType);
  OVar1 = spv::Instruction::getOpCode(this_00);
  if (OVar1 == OpTypeCooperativeMatrixNV) {
    IVar2 = spv::Instruction::getIdOperand(this_00,1);
    IVar3 = spv::Instruction::getIdOperand(this_00,2);
    IVar4 = spv::Instruction::getIdOperand(this_00,3);
    this_local._4_4_ = makeCooperativeMatrixTypeNV(this,component,IVar2,IVar3,IVar4);
  }
  else {
    OVar1 = spv::Instruction::getOpCode(this_00);
    if (OVar1 != OpTypeCooperativeMatrixKHR) {
      __assert_fail("instr->getOpCode() == OpTypeCooperativeMatrixKHR",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x201,"Id spv::Builder::makeCooperativeMatrixTypeWithSameShape(Id, Id)");
    }
    IVar2 = spv::Instruction::getIdOperand(this_00,1);
    IVar3 = spv::Instruction::getIdOperand(this_00,2);
    IVar4 = spv::Instruction::getIdOperand(this_00,3);
    use = spv::Instruction::getIdOperand(this_00,4);
    this_local._4_4_ = makeCooperativeMatrixTypeKHR(this,component,IVar2,IVar3,IVar4,use);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeWithSameShape(Id component, Id otherType)
{
    Instruction* instr = module.getInstruction(otherType);
    if (instr->getOpCode() == OpTypeCooperativeMatrixNV) {
        return makeCooperativeMatrixTypeNV(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3));
    } else {
        assert(instr->getOpCode() == OpTypeCooperativeMatrixKHR);
        return makeCooperativeMatrixTypeKHR(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3), instr->getIdOperand(4));
    }
}